

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<FileHeader>::reallocate
          (QMovableArrayOps<FileHeader> *this,qsizetype alloc,AllocationOption option)

{
  pair<QArrayData_*,_void_*> pVar1;
  
  pVar1 = QArrayData::reallocateUnaligned
                    (&((this->super_QGenericArrayOps<FileHeader>).
                       super_QArrayDataPointer<FileHeader>.d)->super_QArrayData,
                     (this->super_QGenericArrayOps<FileHeader>).super_QArrayDataPointer<FileHeader>.
                     ptr,0x78,alloc,option);
  if (pVar1.second != (void *)0x0) {
    (this->super_QGenericArrayOps<FileHeader>).super_QArrayDataPointer<FileHeader>.d =
         (Data *)pVar1.first;
    (this->super_QGenericArrayOps<FileHeader>).super_QArrayDataPointer<FileHeader>.ptr =
         (FileHeader *)pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }